

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O0

Expression __thiscall
dynet::BidirectionalTreeLSTMBuilder::add_input
          (BidirectionalTreeLSTMBuilder *this,int id,vector<int,_std::allocator<int>_> *children,
          Expression *x)

{
  Expression EVar1;
  Expression EVar2;
  bool bVar3;
  size_type sVar4;
  uint *puVar5;
  uint uVar6;
  RNNBuilder *in_RDX;
  value_type *in_RDI;
  uint child_1;
  uint i;
  Expression rev_embedding;
  uint child;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  Expression fwd_embedding;
  RNNPointer prev;
  Expression embedding;
  value_type *in_stack_ffffffffffffff08;
  Expression *in_stack_ffffffffffffff10;
  ComputationGraph *local_d8;
  undefined8 uStack_d0;
  ComputationGraph *local_c8;
  undefined8 uStack_c0;
  ComputationGraph **local_b0;
  undefined8 local_a8;
  Expression local_a0;
  uint local_90;
  uint local_8c;
  Expression local_88;
  Expression local_78;
  uint local_64;
  int *local_60;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58 [2];
  Expression local_48;
  RNNPointer local_34;
  Expression local_10;
  
  local_34 = 0xffffffff;
  local_48 = RNNBuilder::add_input(in_RDX,(RNNPointer *)in_RDI,in_stack_ffffffffffffff10);
  local_34 = RNNBuilder::state((RNNBuilder *)(in_RDI + 3));
  local_58[0]._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff08);
  local_60 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff08);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff10,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff08);
    if (!bVar3) break;
    puVar5 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(local_58);
    local_64 = *puVar5;
    in_stack_ffffffffffffff10 = in_RDI + 3;
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
              ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)(in_RDI + 0x3d),
               (ulong)local_64);
    local_78 = RNNBuilder::add_input(in_RDX,(RNNPointer *)in_RDI,in_stack_ffffffffffffff10);
    local_48 = local_78;
    local_34 = RNNBuilder::state((RNNBuilder *)(in_RDI + 3));
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (local_58);
  }
  local_34 = 0xffffffff;
  local_88 = RNNBuilder::add_input(in_RDX,(RNNPointer *)in_RDI,in_stack_ffffffffffffff10);
  local_34 = RNNBuilder::state((RNNBuilder *)(in_RDI + 0x20));
  sVar4 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)in_RDX);
  local_8c = (uint)sVar4;
  while (EVar2 = local_48, EVar1 = local_88, uVar6 = local_8c - 1, local_8c != 0) {
    local_8c = uVar6;
    puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)in_RDX,(ulong)uVar6);
    local_90 = *puVar5;
    in_stack_ffffffffffffff08 = in_RDI + 0x20;
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
              ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)(in_RDI + 0x3d),
               (ulong)local_90);
    local_a0 = RNNBuilder::add_input(in_RDX,(RNNPointer *)in_RDI,in_stack_ffffffffffffff10);
    local_88 = local_a0;
    local_34 = RNNBuilder::state((RNNBuilder *)(in_RDI + 0x20));
  }
  local_d8 = local_48.pg;
  uStack_d0._0_4_ = local_48.i;
  uStack_d0._4_4_ = local_48.graph_id;
  local_c8 = local_88.pg;
  uStack_c0._0_4_ = local_88.i;
  uStack_c0._4_4_ = local_88.graph_id;
  local_b0 = &local_d8;
  local_a8 = 2;
  local_8c = uVar6;
  local_88 = EVar1;
  local_48 = EVar2;
  local_10 = concatenate((initializer_list<dynet::Expression> *)in_stack_ffffffffffffff10,
                         (uint)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)in_RDX,in_RDI);
  return local_10;
}

Assistant:

Expression BidirectionalTreeLSTMBuilder::add_input(int id, vector<int> children, const Expression& x) {
  DYNET_ASSERT(id >= 0 && h.size() == (unsigned)id, "Failed dimension check in TreeLSTMBuilder");

  RNNPointer prev = (RNNPointer)(-1);
  Expression fwd_embedding = fwd_node_builder.add_input(prev, x);
  prev = fwd_node_builder.state();
  for (unsigned child : children) {
    fwd_embedding = fwd_node_builder.add_input(prev, h[child]);
    prev = fwd_node_builder.state();
  }

  prev = (RNNPointer)(-1);
  Expression rev_embedding = rev_node_builder.add_input(prev, x);
  prev = rev_node_builder.state();
  for (unsigned i = children.size(); i-- > 0;) {
    unsigned  child = children[i];
    rev_embedding = rev_node_builder.add_input(prev, h[child]);
    prev = rev_node_builder.state();
  }

  Expression embedding = concatenate({fwd_embedding, rev_embedding});
  h.push_back(embedding);

  return embedding;
}